

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last.cpp
# Opt level: O3

void copy_test(bool verbose)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *__dest;
  long *plVar4;
  char *__dest_00;
  ostream *poVar5;
  Framer framer;
  pstring string3;
  pstring string2;
  pstring astring;
  test_resource tpmr;
  char local_1b9;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  char *local_198;
  char *local_190;
  Framer local_188;
  long *local_180;
  char *local_178;
  char *local_170;
  long *local_168;
  undefined8 local_160;
  char *local_158;
  test_resource *local_150;
  undefined8 local_148;
  char *local_140;
  test_resource *local_138;
  undefined8 local_130;
  char *local_128;
  test_resource local_120;
  
  Framer::Framer(&local_188,"copy constructor test",verbose);
  std::pmr::test_resource::test_resource(&local_120,"object",verbose);
  local_120.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  local_130 = 7;
  local_138 = &local_120;
  pcVar3 = (char *)(**(code **)(local_120._0_8_ + 0x10))(&local_120,8,1);
  builtin_strncpy(pcVar3,"barfool",8);
  local_148 = 7;
  local_150 = &local_120;
  local_128 = pcVar3;
  __dest = (char *)(**(code **)(local_120._0_8_ + 0x10))(&local_120,8,1);
  local_178 = __dest;
  local_140 = __dest;
  strcpy(__dest,pcVar3);
  plVar4 = (long *)std::pmr::get_default_resource();
  local_160 = 7;
  local_168 = plVar4;
  __dest_00 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4,8,1);
  local_180 = plVar4;
  local_170 = __dest_00;
  local_158 = __dest_00;
  strcpy(__dest_00,pcVar3);
  local_1b8 = local_1a8;
  local_190 = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar3,pcVar3 + 7);
  iVar2 = std::__cxx11::string::compare((char *)&local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  pcVar1 = local_170;
  local_198 = __dest;
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"astring.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_1b8 = (long *)CONCAT71(local_1b8._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_1b8,1);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,local_190,pcVar3 + 7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1b8,local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"barfool",7);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1b9,1);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    errorCount = errorCount + 1;
  }
  pcVar3 = local_178 + 7;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,local_198,pcVar3);
  iVar2 = std::__cxx11::string::compare((char *)&local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"string2.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_1b8 = (long *)CONCAT71(local_1b8._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_1b8,1);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,local_198,pcVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1b8,local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"barfool",7);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1b9,1);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    errorCount = errorCount + 1;
  }
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,__dest_00,pcVar1 + 7);
  iVar2 = std::__cxx11::string::compare((char *)&local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"string3.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_1b8 = (long *)CONCAT71(local_1b8._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_1b8,1);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,__dest_00,pcVar1 + 7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1b8,local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"barfool",7);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1b9,1);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    errorCount = errorCount + 1;
  }
  (**(code **)(*local_180 + 0x18))(local_180,__dest_00,8,1);
  (**(code **)(local_120._0_8_ + 0x18))(&local_120,local_198,8,1);
  (**(code **)(local_120._0_8_ + 0x18))(&local_120,local_190,8,1);
  std::pmr::test_resource::~test_resource(&local_120);
  Framer::~Framer(&local_188);
  return;
}

Assistant:

void copy_test(bool verbose)
{
    Framer framer{ "copy constructor test", verbose };

    std::pmr::test_resource tpmr{ "object", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };
    pstring string2{ astring, &tpmr };
    pstring string3{ astring };

    ASSERT_EQ(astring.str(), "barfool");
    ASSERT_EQ(string2.str(), "barfool");
    ASSERT_EQ(string3.str(), "barfool");
}